

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void process_bb_ranges(gen_ctx_t gen_ctx,bb_t_conflict bb,MIR_insn_t start_insn,MIR_insn_t tail_insn
                      )

{
  int *piVar1;
  lr_ctx *plVar2;
  size_t nb;
  bool bVar3;
  bb_t_conflict pbVar4;
  bool bVar5;
  int iVar6;
  MIR_reg_t var_00;
  uint uVar7;
  MIR_reg_t MVar8;
  live_range_t_conflict plVar9;
  lr_bb_t_conflict plVar10;
  uint uVar11;
  size_t nel;
  MIR_insn_t_conflict local_90;
  bitmap_iterator_t bi;
  MIR_reg_t var;
  bb_t_conflict local_70;
  MIR_reg_t early_clobbered_hard_reg2;
  MIR_reg_t early_clobbered_hard_reg1;
  MIR_insn_t local_60;
  int op_num;
  insn_var_iterator_t insn_var_iter;
  
  local_60 = start_insn;
  if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
    fprintf((FILE *)gen_ctx->debug_file,"  ------BB%u end: point=%d\n",(ulong)(uint)bb->index,
            (ulong)(uint)gen_ctx->lr_ctx->curr_point);
  }
  bitmap_clear(gen_ctx->lr_ctx->referenced_vars);
  bitmap_clear(gen_ctx->lr_ctx->live_vars);
  local_70 = bb;
  if (bb->out != (bitmap_t)0x0) {
    bi.nbit = 0;
    bi.bitmap = bb->out;
    while (iVar6 = bitmap_iterator_next(&bi,&nel), MVar8 = (MIR_reg_t)nel, iVar6 != 0) {
      var_00 = scan_var_to_var(gen_ctx,(MIR_reg_t)nel);
      make_var_live(gen_ctx,var_00,MVar8,gen_ctx->lr_ctx->curr_point,0);
    }
  }
  do {
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fprintf((FILE *)gen_ctx->debug_file,"  p%-5d",(ulong)(uint)gen_ctx->lr_ctx->curr_point);
      MIR_output_insn(gen_ctx->ctx,gen_ctx->debug_file,tail_insn,(gen_ctx->curr_func_item->u).func,1
                     );
    }
    if ((int)*(ulong *)&tail_insn->field_0x18 == 0xba) {
      iVar6 = var_to_scan_var(gen_ctx,tail_insn->ops[0].u.reg);
      if (-1 < iVar6) {
        make_var_dead(gen_ctx,tail_insn->ops[0].u.reg,iVar6,gen_ctx->lr_ctx->curr_point,1);
        piVar1 = &gen_ctx->lr_ctx->curr_point;
        *piVar1 = *piVar1 + 1;
      }
    }
    else {
      insn_var_iter.nops = *(ulong *)&tail_insn->field_0x18 >> 0x20;
      bVar3 = false;
      insn_var_iter.op_num = 0;
      insn_var_iter.op_part_num = 0;
      bVar5 = true;
      local_90 = tail_insn;
      insn_var_iter.insn = tail_insn;
      while (iVar6 = output_insn_var_iterator_next(gen_ctx,&insn_var_iter,&var,&op_num), MVar8 = var
            , iVar6 != 0) {
        iVar6 = var_to_scan_var(gen_ctx,var);
        if (-1 < iVar6) {
          bVar3 = true;
          make_var_dead(gen_ctx,MVar8,iVar6,gen_ctx->lr_ctx->curr_point,1);
          bVar5 = false;
        }
      }
      if ((gen_ctx->lr_ctx->scan_vars_num == 0) &&
         (0xfffffffc < *(int *)&local_90->field_0x18 - 0xaaU)) {
        if (!bVar5) {
          piVar1 = &gen_ctx->lr_ctx->curr_point;
          *piVar1 = *piVar1 + 1;
        }
        bi.bitmap = gen_ctx->call_used_hard_regs[0x12];
        bi.nbit = 0;
        bVar3 = false;
        while( true ) {
          iVar6 = bitmap_iterator_next(&bi,&nel);
          if (iVar6 == 0) break;
          make_var_dead(gen_ctx,(MIR_reg_t)nel,(MIR_reg_t)nel,gen_ctx->lr_ctx->curr_point,1);
          bVar3 = true;
        }
        bi.bitmap = *(bitmap_t *)
                     ((long)local_90->data + (ulong)(gen_ctx->optimize_level != 0) * 0x40 + 8);
        if (bi.bitmap != (bitmap_t)0x0) {
          bi.nbit = 0;
          while (iVar6 = bitmap_iterator_next(&bi,&nel), iVar6 != 0) {
            make_var_live(gen_ctx,(MIR_reg_t)nel,(MIR_reg_t)nel,gen_ctx->lr_ctx->curr_point,1);
          }
        }
        bi.bitmap = gen_ctx->lr_ctx->live_vars;
        bi.nbit = 0;
        while (iVar6 = bitmap_iterator_next(&bi,&nel), iVar6 != 0) {
          if (0x21 < CONCAT44(nel._4_4_,(MIR_reg_t)nel)) {
            bitmap_set_bit_p(gen_ctx->curr_cfg->call_crossed_regs,(ulong)(MIR_reg_t)nel);
          }
        }
      }
      if (bVar3) {
        piVar1 = &gen_ctx->lr_ctx->curr_point;
        *piVar1 = *piVar1 + 1;
      }
      uVar11 = 0;
      insn_var_iter.insn = local_90;
      insn_var_iter.nops = (size_t)*(uint *)&local_90->field_0x1c;
      insn_var_iter.op_num = 0;
      insn_var_iter.op_part_num = 0;
      while (iVar6 = input_insn_var_iterator_next(gen_ctx,&insn_var_iter,&var,&op_num), MVar8 = var,
            iVar6 != 0) {
        iVar6 = var_to_scan_var(gen_ctx,var);
        if (-1 < iVar6) {
          uVar7 = make_var_live(gen_ctx,MVar8,iVar6,gen_ctx->lr_ctx->curr_point,1);
          uVar11 = uVar11 | uVar7;
        }
      }
      plVar2 = gen_ctx->lr_ctx;
      if (plVar2->scan_vars_num == 0) {
        target_get_early_clobbered_hard_regs
                  (local_90,&early_clobbered_hard_reg1,&early_clobbered_hard_reg2);
        MVar8 = early_clobbered_hard_reg1;
        if (early_clobbered_hard_reg1 != 0xffffffff) {
          uVar11 = 1;
          make_var_live(gen_ctx,early_clobbered_hard_reg1,early_clobbered_hard_reg1,
                        plVar2->curr_point,1);
          make_var_dead(gen_ctx,MVar8,MVar8,gen_ctx->lr_ctx->curr_point,1);
        }
        MVar8 = early_clobbered_hard_reg2;
        if (early_clobbered_hard_reg2 == 0xffffffff) goto LAB_00141f97;
        make_var_live(gen_ctx,early_clobbered_hard_reg2,early_clobbered_hard_reg2,
                      gen_ctx->lr_ctx->curr_point,1);
        make_var_dead(gen_ctx,MVar8,MVar8,gen_ctx->lr_ctx->curr_point,1);
      }
      else {
LAB_00141f97:
        tail_insn = local_90;
        if (uVar11 == 0) goto LAB_00142045;
      }
      piVar1 = &gen_ctx->lr_ctx->curr_point;
      *piVar1 = *piVar1 + 1;
      tail_insn = local_90;
    }
LAB_00142045:
    pbVar4 = local_70;
    if (tail_insn == local_60) {
      iVar6 = bitmap_equal_p(local_70->in,gen_ctx->lr_ctx->live_vars);
      if (iVar6 == 0) {
        __assert_fail("bitmap_equal_p (bb->in, gen_ctx->lr_ctx->live_vars)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1965,"void process_bb_ranges(gen_ctx_t, bb_t, MIR_insn_t, MIR_insn_t)");
      }
      bi.bitmap = pbVar4->in;
      bi.nbit = 0;
      while( true ) {
        do {
          iVar6 = bitmap_iterator_next(&bi,&nel);
          pbVar4 = local_70;
          uVar11 = (MIR_reg_t)nel;
          if (iVar6 == 0) {
            if (gen_ctx->lr_ctx->scan_vars_num == 0) {
              bitmap_clear(local_70->gen);
              bitmap_clear(pbVar4->kill);
              bi.bitmap = gen_ctx->lr_ctx->referenced_vars;
              bi.nbit = 0;
              while (iVar6 = bitmap_iterator_next(&bi,&nel), iVar6 != 0) {
                if (0x21 < CONCAT44(nel._4_4_,(MIR_reg_t)nel)) {
                  bitmap_set_bit_p(pbVar4->kill,CONCAT44(nel._4_4_,(MIR_reg_t)nel));
                }
              }
            }
            iVar6 = bitmap_empty_p(pbVar4->in);
            if (iVar6 == 0) {
              piVar1 = &gen_ctx->lr_ctx->curr_point;
              *piVar1 = *piVar1 + 1;
            }
            return;
          }
          nb = CONCAT44(nel._4_4_,(MIR_reg_t)nel);
          MVar8 = scan_var_to_var(gen_ctx,(MIR_reg_t)nel);
          make_var_dead(gen_ctx,MVar8,uVar11,gen_ctx->lr_ctx->curr_point,0);
        } while ((gen_ctx->lr_ctx->scan_vars_num != 0) ||
                (iVar6 = bitmap_bit_p(gen_ctx->lr_ctx->referenced_vars,nb), iVar6 != 0));
        plVar9 = VARR_live_range_tget(gen_ctx->lr_ctx->var_live_ranges,(ulong)uVar11);
        if ((plVar9 == (live_range_t_conflict)0x0) || (plVar9->lr_bb != (lr_bb_t_conflict)0x0))
        break;
        plVar10 = gen_ctx->lr_ctx->free_lr_bb_list;
        if (plVar10 == (lr_bb_t_conflict)0x0) {
          plVar10 = (lr_bb_t_conflict)gen_malloc(gen_ctx,0x10);
        }
        else {
          gen_ctx->lr_ctx->free_lr_bb_list = plVar10->next;
        }
        plVar10->bb = local_70;
        plVar10->next = (lr_bb_t)0x0;
        plVar9->lr_bb = plVar10;
      }
      __assert_fail("lr != ((void*)0) && lr->lr_bb == ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x18a8,"void add_lr_bb(gen_ctx_t, MIR_reg_t, bb_t)");
    }
    tail_insn = (tail_insn->insn_link).prev;
  } while( true );
}

Assistant:

static void process_bb_ranges (gen_ctx_t gen_ctx, bb_t bb, MIR_insn_t start_insn,
                               MIR_insn_t tail_insn) {
  MIR_reg_t var, reg, early_clobbered_hard_reg1, early_clobbered_hard_reg2;
  size_t nel;
  int scan_var, op_num, incr_p;
  bitmap_iterator_t bi;
  insn_var_iterator_t insn_var_iter;

  DEBUG (2, {
    fprintf (debug_file, "  ------BB%u end: point=%d\n", (unsigned) bb->index, curr_point);
  });
  bitmap_clear (referenced_vars);
  bitmap_clear (live_vars);
  if (bb->live_out != NULL) FOREACH_BITMAP_BIT (bi, bb->live_out, nel) {
      make_var_live (gen_ctx, scan_var_to_var (gen_ctx, (int) nel), (int) nel, curr_point, FALSE);
    }
  for (MIR_insn_t insn = tail_insn;; insn = DLIST_PREV (MIR_insn_t, insn)) {
    DEBUG (2, {
      fprintf (debug_file, "  p%-5d", curr_point);
      MIR_output_insn (gen_ctx->ctx, debug_file, insn, curr_func_item->u.func, TRUE);
    });
    if (insn->code == MIR_PHI) {
      if ((scan_var = var_to_scan_var (gen_ctx, insn->ops[0].u.var)) >= 0) {
        make_var_dead (gen_ctx, insn->ops[0].u.var, scan_var, curr_point, TRUE);
        curr_point++;
      }
      if (insn == start_insn) break;
      continue;
    }
    incr_p = FALSE;
    FOREACH_OUT_INSN_VAR (gen_ctx, insn_var_iter, insn, var, op_num) {
      if ((scan_var = var_to_scan_var (gen_ctx, var)) < 0) continue;
      incr_p |= make_var_dead (gen_ctx, var, scan_var, curr_point, TRUE);
    }
    if (scan_vars_num == 0 && MIR_call_code_p (insn->code)) {
      if (incr_p) curr_point++;
      incr_p = FALSE;
      FOREACH_BITMAP_BIT (bi, call_used_hard_regs[MIR_T_UNDEF], nel) {
        make_var_dead (gen_ctx, (MIR_reg_t) nel, (int) nel, curr_point, TRUE);
        incr_p = TRUE;
      }
      bitmap_t args = (optimize_level > 0 ? ((bb_insn_t) insn->data)->call_hard_reg_args
                                          : ((insn_data_t) insn->data)->u.call_hard_reg_args);
      if (args != NULL) {
        FOREACH_BITMAP_BIT (bi, args, nel) {
          make_var_live (gen_ctx, (MIR_reg_t) nel, (int) nel, curr_point, TRUE);
        }
      }
      FOREACH_BITMAP_BIT (bi, live_vars, nel) {
        MIR_reg_t live_reg;

        if (nel <= MAX_HARD_REG) continue;
        live_reg = (MIR_reg_t) nel;
        bitmap_set_bit_p (curr_cfg->call_crossed_regs, live_reg);
      }
    }
    if (incr_p) curr_point++;
    incr_p = FALSE;
    FOREACH_IN_INSN_VAR (gen_ctx, insn_var_iter, insn, var, op_num) {
      if ((scan_var = var_to_scan_var (gen_ctx, var)) < 0) continue;
      incr_p |= make_var_live (gen_ctx, var, scan_var, curr_point, TRUE);
    }
    if (scan_vars_num == 0) {
      target_get_early_clobbered_hard_regs (insn, &early_clobbered_hard_reg1,
                                            &early_clobbered_hard_reg2);
      if ((reg = early_clobbered_hard_reg1) != MIR_NON_VAR) {
        incr_p |= make_var_live (gen_ctx, reg, (int) reg, curr_point, TRUE);
        incr_p |= make_var_dead (gen_ctx, reg, (int) reg, curr_point, TRUE);
      }
      if ((reg = early_clobbered_hard_reg2) != MIR_NON_VAR) {
        incr_p |= make_var_live (gen_ctx, reg, (int) reg, curr_point, TRUE);
        incr_p |= make_var_dead (gen_ctx, reg, (int) reg, curr_point, TRUE);
      }
    }
    if (incr_p) curr_point++;
    if (insn == start_insn) break;
  }
  gen_assert (bitmap_equal_p (bb->live_in, live_vars));
  FOREACH_BITMAP_BIT (bi, bb->live_in, nel) {
    make_var_dead (gen_ctx, scan_var_to_var (gen_ctx, (int) nel), (int) nel, curr_point, FALSE);
    if (scan_vars_num == 0 && !bitmap_bit_p (referenced_vars, nel))
      add_lr_bb (gen_ctx, (MIR_reg_t) nel, bb);
  }
  if (scan_vars_num == 0) { /* setup spill info for RA */
    bitmap_clear (bb->spill_gen);
    bitmap_clear (bb->spill_kill);
    FOREACH_BITMAP_BIT (bi, referenced_vars, nel) {
      if (nel > MAX_HARD_REG) bitmap_set_bit_p (bb->spill_kill, nel);
    }
  }
  if (!bitmap_empty_p (bb->live_in)) curr_point++;
}